

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>::erase
          (Span<QHashPrivate::Node<std::pair<int,_int>,_std::function<bool_(const_void_*,_void_*)>_>_>
           *this,size_t bucket)

{
  byte bVar1;
  code *pcVar2;
  Entry *pEVar3;
  uchar *puVar4;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar3 = this->entries;
  pcVar2 = *(code **)(pEVar3[bVar1].storage.data + 0x18);
  if (pcVar2 != (code *)0x0) {
    puVar4 = pEVar3[bVar1].storage.data + 8;
    (*pcVar2)(puVar4,puVar4,3);
    pEVar3 = this->entries;
  }
  pEVar3[bVar1].storage.data[0] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }